

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void os_get_charmap(char *mapname,int charmap_id)

{
  char cVar1;
  int iVar2;
  char *s1;
  char *pcVar3;
  char *pcVar4;
  char *s1_00;
  
  s1 = nl_langinfo(0xe);
  if (s1 != (char *)0x0) {
    iVar2 = stricmp(s1,"ANSI_X3.4-1968");
    pcVar3 = s1;
    pcVar4 = s1;
    if (iVar2 == 0) {
      pcVar3 = "us-ascii";
    }
    else {
      do {
        do {
          s1_00 = pcVar3;
          pcVar3 = pcVar4 + 1;
          cVar1 = *pcVar4;
          pcVar4 = pcVar3;
        } while (cVar1 == '.');
        pcVar3 = s1_00;
      } while (cVar1 != '\0');
      if (*s1_00 == '\0') {
        s1_00 = s1;
      }
      iVar2 = stricmp(s1_00,"KOI8-R");
      if (iVar2 == 0) {
        pcVar3 = "koi8-r";
      }
      else {
        iVar2 = stricmp(s1_00,"ISO-8859-1");
        pcVar3 = "iso1";
        if (iVar2 != 0) {
          iVar2 = stricmp(s1_00,"ISO-8859-2");
          if (iVar2 == 0) {
            pcVar3 = "iso2";
          }
          else {
            iVar2 = stricmp(s1_00,"ISO-8859-3");
            if (iVar2 == 0) {
              pcVar3 = "iso3";
            }
            else {
              iVar2 = stricmp(s1_00,"ISO-8859-4");
              pcVar3 = "iso4";
              if (iVar2 != 0) {
                iVar2 = stricmp(s1_00,"ISO-8859-5");
                pcVar3 = "iso5";
                if (iVar2 != 0) {
                  iVar2 = stricmp(s1_00,"ISO-8859-6");
                  pcVar3 = "iso6";
                  if (iVar2 != 0) {
                    iVar2 = stricmp(s1_00,"ISO-8859-7");
                    pcVar3 = "iso7";
                    if (iVar2 != 0) {
                      iVar2 = stricmp(s1_00,"ISO-8859-8");
                      pcVar3 = "iso8";
                      if (iVar2 != 0) {
                        iVar2 = stricmp(s1_00,"ISO-8859-9");
                        pcVar3 = "iso9";
                        if (iVar2 != 0) {
                          iVar2 = stricmp(s1_00,"ISO-8859-10");
                          pcVar3 = "iso10";
                          if ((iVar2 != 0) &&
                             (iVar2 = stricmp(s1_00,"8859-1"), pcVar3 = "iso1", iVar2 != 0)) {
                            iVar2 = stricmp(s1_00,"8859-2");
                            pcVar3 = "iso2";
                            if (iVar2 != 0) {
                              iVar2 = stricmp(s1_00,"8859-3");
                              pcVar3 = "iso3";
                              if (iVar2 != 0) {
                                iVar2 = stricmp(s1_00,"8859-4");
                                pcVar3 = "iso4";
                                if (iVar2 != 0) {
                                  iVar2 = stricmp(s1_00,"8859-5");
                                  pcVar3 = "iso5";
                                  if (iVar2 != 0) {
                                    iVar2 = stricmp(s1_00,"8859-6");
                                    pcVar3 = "iso6";
                                    if (iVar2 != 0) {
                                      iVar2 = stricmp(s1_00,"8859-7");
                                      pcVar3 = "iso7";
                                      if (iVar2 != 0) {
                                        iVar2 = stricmp(s1_00,"8859-8");
                                        pcVar3 = "iso8";
                                        if (iVar2 != 0) {
                                          iVar2 = stricmp(s1_00,"8859-9");
                                          pcVar3 = "iso9";
                                          if (iVar2 != 0) {
                                            iVar2 = stricmp(s1_00,"8859-10");
                                            pcVar3 = "iso10";
                                            if (iVar2 != 0) {
                                              iVar2 = stricmp(s1_00,"CP1250");
                                              pcVar3 = "cp1250";
                                              if (((iVar2 != 0) &&
                                                  (iVar2 = stricmp(s1_00,"CP-1250"), iVar2 != 0)) &&
                                                 (iVar2 = stricmp(s1_00,"CP_1250"), iVar2 != 0)) {
                                                iVar2 = stricmp(s1_00,"CP1251");
                                                pcVar3 = "cp1251";
                                                if (((iVar2 != 0) &&
                                                    (iVar2 = stricmp(s1_00,"CP-1251"), iVar2 != 0))
                                                   && (iVar2 = stricmp(s1_00,"CP_1251"), iVar2 != 0)
                                                   ) {
                                                  iVar2 = stricmp(s1_00,"CP1252");
                                                  pcVar3 = "cp1252";
                                                  if (((iVar2 != 0) &&
                                                      (iVar2 = stricmp(s1_00,"CP-1252"), iVar2 != 0)
                                                      ) && (iVar2 = stricmp(s1_00,"CP_1252"),
                                                           iVar2 != 0)) {
                                                    iVar2 = stricmp(s1_00,"CP1253");
                                                    pcVar3 = "cp1253";
                                                    if (((iVar2 != 0) &&
                                                        (iVar2 = stricmp(s1_00,"CP-1253"),
                                                        iVar2 != 0)) &&
                                                       (iVar2 = stricmp(s1_00,"CP_1253"), iVar2 != 0
                                                       )) {
                                                      iVar2 = stricmp(s1_00,"CP1254");
                                                      pcVar3 = "cp1254";
                                                      if (((iVar2 != 0) &&
                                                          (iVar2 = stricmp(s1_00,"CP-1254"),
                                                          iVar2 != 0)) &&
                                                         (iVar2 = stricmp(s1_00,"CP_1254"),
                                                         iVar2 != 0)) {
                                                        iVar2 = stricmp(s1_00,"CP1255");
                                                        pcVar3 = "cp1255";
                                                        if (((iVar2 != 0) &&
                                                            (iVar2 = stricmp(s1_00,"CP-1255"),
                                                            iVar2 != 0)) &&
                                                           (iVar2 = stricmp(s1_00,"CP_1255"),
                                                           iVar2 != 0)) {
                                                          iVar2 = stricmp(s1_00,"CP1256");
                                                          pcVar3 = "cp1256";
                                                          if (((iVar2 != 0) &&
                                                              (iVar2 = stricmp(s1_00,"CP-1256"),
                                                              iVar2 != 0)) &&
                                                             (iVar2 = stricmp(s1_00,"CP_1256"),
                                                             iVar2 != 0)) {
                                                            iVar2 = stricmp(s1_00,"CP1257");
                                                            pcVar3 = "cp1257";
                                                            if (((iVar2 != 0) &&
                                                                (iVar2 = stricmp(s1_00,"CP-1257"),
                                                                iVar2 != 0)) &&
                                                               (iVar2 = stricmp(s1_00,"CP_1257"),
                                                               iVar2 != 0)) {
                                                              iVar2 = stricmp(s1_00,"CP1258");
                                                              pcVar3 = "cp1258";
                                                              if (((iVar2 != 0) &&
                                                                  (iVar2 = stricmp(s1_00,"CP-1258"),
                                                                  iVar2 != 0)) &&
                                                                 (iVar2 = stricmp(s1_00,"CP_1258"),
                                                                 iVar2 != 0)) {
                                                                iVar2 = stricmp(s1_00,"CP437");
                                                                pcVar3 = "cp437";
                                                                if (((((iVar2 != 0) &&
                                                                      (iVar2 = stricmp(s1_00,
                                                  "CP-437"), iVar2 != 0)) &&
                                                  (iVar2 = stricmp(s1_00,"CP_437"), iVar2 != 0)) &&
                                                  ((iVar2 = stricmp(s1_00,"PC437"), iVar2 != 0 &&
                                                   (iVar2 = stricmp(s1_00,"PC-437"), iVar2 != 0))))
                                                  && (iVar2 = stricmp(s1_00,"PC_437"), iVar2 != 0))
                                                  {
                                                    iVar2 = stricmp(s1_00,"CP737");
                                                    pcVar3 = "cp737";
                                                    if (((iVar2 != 0) &&
                                                        (iVar2 = stricmp(s1_00,"CP-737"), iVar2 != 0
                                                        )) && ((iVar2 = stricmp(s1_00,"CP_737"),
                                                               iVar2 != 0 &&
                                                               (((iVar2 = stricmp(s1_00,"PC737"),
                                                                 iVar2 != 0 &&
                                                                 (iVar2 = stricmp(s1_00,"PC-737"),
                                                                 iVar2 != 0)) &&
                                                                (iVar2 = stricmp(s1_00,"PC_737"),
                                                                iVar2 != 0)))))) {
                                                      iVar2 = stricmp(s1_00,"CP775");
                                                      pcVar3 = "cp775";
                                                      if (((iVar2 != 0) &&
                                                          (iVar2 = stricmp(s1_00,"CP-775"),
                                                          iVar2 != 0)) &&
                                                         ((iVar2 = stricmp(s1_00,"CP_775"),
                                                          iVar2 != 0 &&
                                                          (((iVar2 = stricmp(s1_00,"PC775"),
                                                            iVar2 != 0 &&
                                                            (iVar2 = stricmp(s1_00,"PC-775"),
                                                            iVar2 != 0)) &&
                                                           (iVar2 = stricmp(s1_00,"PC_775"),
                                                           iVar2 != 0)))))) {
                                                        iVar2 = stricmp(s1_00,"CP850");
                                                        pcVar3 = "cp850";
                                                        if (((((iVar2 != 0) &&
                                                              (iVar2 = stricmp(s1_00,"CP-850"),
                                                              iVar2 != 0)) &&
                                                             (iVar2 = stricmp(s1_00,"CP_850"),
                                                             iVar2 != 0)) &&
                                                            ((iVar2 = stricmp(s1_00,"PC850"),
                                                             iVar2 != 0 &&
                                                             (iVar2 = stricmp(s1_00,"PC-850"),
                                                             iVar2 != 0)))) &&
                                                           (iVar2 = stricmp(s1_00,"PC_850"),
                                                           iVar2 != 0)) {
                                                          iVar2 = stricmp(s1_00,"CP852");
                                                          pcVar3 = "cp852";
                                                          if (((iVar2 != 0) &&
                                                              (iVar2 = stricmp(s1_00,"CP-852"),
                                                              iVar2 != 0)) &&
                                                             ((iVar2 = stricmp(s1_00,"CP_852"),
                                                              iVar2 != 0 &&
                                                              (((iVar2 = stricmp(s1_00,"PC852"),
                                                                iVar2 != 0 &&
                                                                (iVar2 = stricmp(s1_00,"PC-852"),
                                                                iVar2 != 0)) &&
                                                               (iVar2 = stricmp(s1_00,"PC_852"),
                                                               iVar2 != 0)))))) {
                                                            iVar2 = stricmp(s1_00,"CP855");
                                                            pcVar3 = "cp855";
                                                            if (((((iVar2 != 0) &&
                                                                  (iVar2 = stricmp(s1_00,"CP-855"),
                                                                  iVar2 != 0)) &&
                                                                 (iVar2 = stricmp(s1_00,"CP_855"),
                                                                 iVar2 != 0)) &&
                                                                ((iVar2 = stricmp(s1_00,"PC855"),
                                                                 iVar2 != 0 &&
                                                                 (iVar2 = stricmp(s1_00,"PC-855"),
                                                                 iVar2 != 0)))) &&
                                                               (iVar2 = stricmp(s1_00,"PC_855"),
                                                               iVar2 != 0)) {
                                                              iVar2 = stricmp(s1_00,"CP857");
                                                              pcVar3 = "cp857";
                                                              if (((((iVar2 != 0) &&
                                                                    (iVar2 = stricmp(s1_00,"CP-857")
                                                                    , iVar2 != 0)) &&
                                                                   (iVar2 = stricmp(s1_00,"CP_857"),
                                                                   iVar2 != 0)) &&
                                                                  ((iVar2 = stricmp(s1_00,"PC857"),
                                                                   iVar2 != 0 &&
                                                                   (iVar2 = stricmp(s1_00,"PC-857"),
                                                                   iVar2 != 0)))) &&
                                                                 (iVar2 = stricmp(s1_00,"PC_857"),
                                                                 iVar2 != 0)) {
                                                                iVar2 = stricmp(s1_00,"CP860");
                                                                pcVar3 = "cp860";
                                                                if (((iVar2 != 0) &&
                                                                    (iVar2 = stricmp(s1_00,"CP-860")
                                                                    , iVar2 != 0)) &&
                                                                   ((iVar2 = stricmp(s1_00,"CP_860")
                                                                    , iVar2 != 0 &&
                                                                    (((iVar2 = stricmp(s1_00,"PC860"
                                                                                      ), iVar2 != 0
                                                                      && (iVar2 = stricmp(s1_00,
                                                  "PC-860"), iVar2 != 0)) &&
                                                  (iVar2 = stricmp(s1_00,"PC_860"), iVar2 != 0))))))
                                                  {
                                                    iVar2 = stricmp(s1_00,"CP861");
                                                    pcVar3 = "cp861";
                                                    if (((((iVar2 != 0) &&
                                                          (iVar2 = stricmp(s1_00,"CP-861"),
                                                          iVar2 != 0)) &&
                                                         (iVar2 = stricmp(s1_00,"CP_861"),
                                                         iVar2 != 0)) &&
                                                        ((iVar2 = stricmp(s1_00,"PC861"), iVar2 != 0
                                                         && (iVar2 = stricmp(s1_00,"PC-861"),
                                                            iVar2 != 0)))) &&
                                                       (iVar2 = stricmp(s1_00,"PC_861"), iVar2 != 0)
                                                       ) {
                                                      iVar2 = stricmp(s1_00,"CP862");
                                                      pcVar3 = "cp862";
                                                      if ((((iVar2 != 0) &&
                                                           (iVar2 = stricmp(s1_00,"CP-862"),
                                                           iVar2 != 0)) &&
                                                          (iVar2 = stricmp(s1_00,"CP_862"),
                                                          iVar2 != 0)) &&
                                                         (((iVar2 = stricmp(s1_00,"PC862"),
                                                           iVar2 != 0 &&
                                                           (iVar2 = stricmp(s1_00,"PC-862"),
                                                           iVar2 != 0)) &&
                                                          (iVar2 = stricmp(s1_00,"PC_862"),
                                                          iVar2 != 0)))) {
                                                        iVar2 = stricmp(s1_00,"CP863");
                                                        pcVar3 = "cp863";
                                                        if (((iVar2 != 0) &&
                                                            (iVar2 = stricmp(s1_00,"CP-863"),
                                                            iVar2 != 0)) &&
                                                           ((iVar2 = stricmp(s1_00,"CP_863"),
                                                            iVar2 != 0 &&
                                                            (((iVar2 = stricmp(s1_00,"PC863"),
                                                              iVar2 != 0 &&
                                                              (iVar2 = stricmp(s1_00,"PC-863"),
                                                              iVar2 != 0)) &&
                                                             (iVar2 = stricmp(s1_00,"PC_863"),
                                                             iVar2 != 0)))))) {
                                                          iVar2 = stricmp(s1_00,"CP864");
                                                          pcVar3 = "cp864";
                                                          if (((iVar2 != 0) &&
                                                              (iVar2 = stricmp(s1_00,"CP-864"),
                                                              iVar2 != 0)) &&
                                                             ((iVar2 = stricmp(s1_00,"CP_864"),
                                                              iVar2 != 0 &&
                                                              (((iVar2 = stricmp(s1_00,"PC864"),
                                                                iVar2 != 0 &&
                                                                (iVar2 = stricmp(s1_00,"PC-864"),
                                                                iVar2 != 0)) &&
                                                               (iVar2 = stricmp(s1_00,"PC_864"),
                                                               iVar2 != 0)))))) {
                                                            iVar2 = stricmp(s1_00,"CP865");
                                                            pcVar3 = "cp865";
                                                            if (((((iVar2 != 0) &&
                                                                  (iVar2 = stricmp(s1_00,"CP-865"),
                                                                  iVar2 != 0)) &&
                                                                 (iVar2 = stricmp(s1_00,"CP_865"),
                                                                 iVar2 != 0)) &&
                                                                ((iVar2 = stricmp(s1_00,"PC865"),
                                                                 iVar2 != 0 &&
                                                                 (iVar2 = stricmp(s1_00,"PC-865"),
                                                                 iVar2 != 0)))) &&
                                                               (iVar2 = stricmp(s1_00,"PC_865"),
                                                               iVar2 != 0)) {
                                                              iVar2 = stricmp(s1_00,"CP866");
                                                              pcVar3 = "cp866";
                                                              if (((iVar2 != 0) &&
                                                                  (iVar2 = stricmp(s1_00,"CP-866"),
                                                                  iVar2 != 0)) &&
                                                                 ((iVar2 = stricmp(s1_00,"CP_866"),
                                                                  iVar2 != 0 &&
                                                                  (((iVar2 = stricmp(s1_00,"PC866"),
                                                                    iVar2 != 0 &&
                                                                    (iVar2 = stricmp(s1_00,"PC-866")
                                                                    , iVar2 != 0)) &&
                                                                   (iVar2 = stricmp(s1_00,"PC_866"),
                                                                   iVar2 != 0)))))) {
                                                                iVar2 = stricmp(s1_00,"CP869");
                                                                pcVar3 = "cp869";
                                                                if (((iVar2 != 0) &&
                                                                    (iVar2 = stricmp(s1_00,"CP-869")
                                                                    , iVar2 != 0)) &&
                                                                   ((iVar2 = stricmp(s1_00,"CP_869")
                                                                    , iVar2 != 0 &&
                                                                    (((iVar2 = stricmp(s1_00,"PC869"
                                                                                      ), iVar2 != 0
                                                                      && (iVar2 = stricmp(s1_00,
                                                  "PC-869"), iVar2 != 0)) &&
                                                  (iVar2 = stricmp(s1_00,"PC_869"), iVar2 != 0))))))
                                                  {
                                                    iVar2 = stricmp(s1_00,"CP874");
                                                    pcVar3 = "cp874";
                                                    if (((((iVar2 != 0) &&
                                                          (iVar2 = stricmp(s1_00,"CP-874"),
                                                          iVar2 != 0)) &&
                                                         (iVar2 = stricmp(s1_00,"CP_874"),
                                                         iVar2 != 0)) &&
                                                        ((iVar2 = stricmp(s1_00,"PC874"), iVar2 != 0
                                                         && (iVar2 = stricmp(s1_00,"PC-874"),
                                                            iVar2 != 0)))) &&
                                                       (iVar2 = stricmp(s1_00,"PC_874"), pcVar3 = s1
                                                       , iVar2 == 0)) {
                                                      pcVar3 = "cp874";
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    strcpy(mapname,pcVar3);
    return;
  }
  builtin_strncpy(mapname,"us-ascii",9);
  return;
}

Assistant:

void
os_get_charmap( char* mapname, int charmap_id )
{
    const char* charset = 0;  // Character set name.

#ifdef RUNTIME
    // If there was a command line option, it takes precedence.
    // User knows better, so do not try to modify his setting.
    if (not globalApp->options.characterSet.empty()) {
        // One charset for all.
        strncpy(mapname, globalApp->options.characterSet.c_str(), 32);
        return;
    }
#endif

    // There is absolutely no robust way to determine the local
    // character set.  Roughly speaking, we have three options:
    //
    // Use nl_langinfo() function.  Not always available.
    //
    // Use setlocale(LC_CTYPE, NULL).  This only works if user set
    // locale which is actually installed on the machine, or else
    // it will return NULL.  But we don't need locale, we just need
    // to know what the user wants.
    //
    // Manually look up environment variables LC_ALL, LC_CTYPE and
    // LANG.
    //
    // However, not a single one will provide us with a reliable
    // name of local character set.  There is no standard way to
    // name charsets.  For a single set we can get almost anything:
    // Windows-1251, Win-1251, CP1251, CP-1251, ru_RU.CP1251,
    // ru_RU.CP-1251, ru_RU.CP_1251...  And the only way is to
    // maintain a database of aliases.

#if HAVE_LANGINFO_CODESET
    charset = nl_langinfo(CODESET);
#else
    charset = getenv("LC_CTYPE");
    if (charset == 0 or charset[0] == '\0') {
        charset = getenv("LC_ALL");
        if (charset == 0 or charset[0] == '\0') {
            charset = getenv("LANG");
        }
    }
#endif

    if (charset == 0) {
        strcpy(mapname, "us-ascii");
    } else {
        strcpy(mapname, get_charset_alias(charset));
    }
    return;
}